

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O3

void __thiscall optimization::livevar_analyse::Livevar_Analyse::unroll_phi(Livevar_Analyse *this)

{
  pointer pcVar1;
  uint32_t uVar2;
  MirFunction *pMVar3;
  Livevar_Analyse *pLVar4;
  int iVar5;
  ostream *poVar6;
  mapped_type *__k;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  undefined8 uVar10;
  _Base_ptr p_Var11;
  Tag *in_RSI;
  char *function;
  _Base_ptr *pp_Var12;
  ulong uVar13;
  pair<std::_Rb_tree_iterator<mir::inst::VarId>,_bool> pVar14;
  VarId var;
  Var_Replace vp;
  ostream local_149;
  Livevar_Analyse *local_148;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_140;
  size_type local_138;
  undefined1 local_130 [16];
  key_type local_120;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  undefined1 local_100 [8];
  undefined1 local_f8 [17];
  undefined7 uStack_e7;
  undefined1 local_d8;
  _Rb_tree_node_base *local_d0;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *local_c8;
  _func_int **local_c0;
  _func_int **local_b8;
  undefined1 local_b0 [8];
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_a8;
  undefined1 local_78 [48];
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  local_149 = (ostream)0x0;
  local_148 = this;
  AixLog::operator<<(&local_149,(Severity *)in_RSI);
  local_100 = (undefined1  [8])&PTR__Tag_001eaf88;
  local_f8._8_8_ = (_Base_ptr)0x0;
  local_f8[0x10] = 0;
  local_d8 = 1;
  local_f8._0_8_ = (_Rb_tree_node_base *)(local_f8 + 0x10);
  AixLog::operator<<((ostream *)local_100,in_RSI);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = &PTR__Timestamp_001eaf58;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)in_RSI);
  pp_Var12 = (_Base_ptr *)&local_110;
  local_120.super_Displayable._vptr_Displayable = (_func_int **)pp_Var12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"unroll_phi","");
  function = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/livevar_analyse.hpp"
  ;
  local_140._M_head_impl = (Inst *)local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/livevar_analyse.hpp"
             ,"");
  local_a8._M_impl._0_8_ = &local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_b0 = (undefined1  [8])&PTR__Function_001eafb8;
  if ((_Base_ptr *)local_120.super_Displayable._vptr_Displayable == pp_Var12) {
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)uStack_108;
  }
  else {
    local_a8._M_impl._0_8_ = local_120.super_Displayable._vptr_Displayable;
  }
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_78;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = local_120.id;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = local_120._12_4_;
  local_120.id = 0;
  local_120._12_4_ = 0;
  local_110 = 0;
  if (local_140._M_head_impl == (Inst *)local_130) {
    local_78._8_8_ = local_130._8_8_;
  }
  else {
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_140._M_head_impl;
  }
  local_a8._M_impl.super__Rb_tree_header._M_node_count = local_138;
  local_138 = 0;
  local_130[0] = 0;
  local_78._16_8_ = (_Base_ptr)0xf2;
  local_78[0x18] = false;
  local_140._M_head_impl = (Inst *)local_130;
  local_120.super_Displayable._vptr_Displayable = (_func_int **)pp_Var12;
  AixLog::operator<<((ostream *)local_b0,(Function *)function);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog," is unrolling phi for ",0x16);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,(local_148->func->name)._M_dataplus._M_p,
                      (local_148->func->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_b0);
  if (local_140._M_head_impl != (Inst *)local_130) {
    operator_delete(local_140._M_head_impl,CONCAT71(local_130._1_7_,local_130[0]) + 1);
  }
  if ((_Base_ptr *)local_120.super_Displayable._vptr_Displayable != pp_Var12) {
    operator_delete(local_120.super_Displayable._vptr_Displayable,CONCAT71(uStack_10f,local_110) + 1
                   );
  }
  local_100 = (undefined1  [8])&PTR__Tag_001eaf88;
  if ((_Rb_tree_node_base *)local_f8._0_8_ != (_Rb_tree_node_base *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_,CONCAT71(uStack_e7,local_f8[0x10]) + 1);
  }
  pLVar4 = local_148;
  var_replace::Var_Replace::Var_Replace((Var_Replace *)local_b0,local_148->func);
  p_Var9 = (pLVar4->func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d0 = &(pLVar4->func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_d0) {
    local_c8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)&local_148->phi_dests;
    local_b8 = (_func_int **)&PTR_display_001ecfe8;
    local_c0 = (_func_int **)&PTR_display_001ecf98;
    do {
      p_Var11 = p_Var9[3]._M_parent;
      if (p_Var9[3]._M_left != p_Var11) {
        uVar13 = 0;
        do {
          iVar5 = (**(code **)(**(long **)(&p_Var11->_M_color + uVar13 * 2) + 8))();
          if (iVar5 == 7) {
            pVar14 = std::
                     _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                     ::_M_insert_unique<mir::inst::VarId_const&>
                               (local_c8,(VarId *)(*(long *)(&p_Var11->_M_color + uVar13 * 2) + 8));
            (**(code **)(**(long **)(&p_Var11->_M_color + uVar13 * 2) + 0x10))
                      (local_100,*(long **)(&p_Var11->_M_color + uVar13 * 2),pVar14._8_8_);
            for (p_Var8 = (_Rb_tree_node_base *)CONCAT71(uStack_e7,local_f8[0x10]);
                p_Var8 != (_Rb_tree_node_base *)local_f8;
                p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
              local_120.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
              local_120.id = *(uint32_t *)&p_Var8[1]._M_parent;
              pMVar3 = local_148->func;
              __k = std::
                    map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                    ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                          *)local_78,&local_120);
              pmVar7 = std::
                       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                       ::at(&pMVar3->basic_blks,&__k->first);
              if ((ulong)((long)p_Var9[3]._M_left - (long)p_Var9[3]._M_parent >> 3) <= uVar13) {
                uVar10 = std::__throw_out_of_range_fmt
                                   ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                    ,uVar13);
                if ((_Base_ptr *)local_120.super_Displayable._vptr_Displayable != pp_Var12) {
                  operator_delete(local_120.super_Displayable._vptr_Displayable,
                                  CONCAT71(uStack_10f,local_110) + 1);
                }
                local_100 = (undefined1  [8])p_Var9;
                if ((_Rb_tree_node_base *)local_f8._0_8_ != p_Var8) {
                  operator_delete((void *)local_f8._0_8_,CONCAT71(uStack_e7,local_f8[0x10]) + 1);
                }
                _Unwind_Resume(uVar10);
              }
              pp_Var12 = *(_Base_ptr **)(&(p_Var9[3]._M_parent)->_M_color + uVar13 * 2);
              local_140._M_head_impl = (Inst *)operator_new(0x38);
              uVar2 = *(uint32_t *)(pp_Var12 + 2);
              ((local_140._M_head_impl)->dest).super_Displayable._vptr_Displayable =
                   (_func_int **)&PTR_display_001eb100;
              ((local_140._M_head_impl)->dest).id = uVar2;
              ((local_140._M_head_impl)->super_Displayable)._vptr_Displayable = local_b8;
              *(char *)&local_140._M_head_impl[2].super_Displayable._vptr_Displayable = '\x01';
              local_140._M_head_impl[1].dest.super_Displayable._vptr_Displayable =
                   (_func_int **)&PTR_display_001eb100;
              local_140._M_head_impl[1].dest.id = local_120.id;
              local_140._M_head_impl[1].super_Displayable._vptr_Displayable = local_c0;
              pcVar1 = (pointer)((long)&local_140._M_head_impl[2].super_Displayable.
                                        _vptr_Displayable + 1);
              pcVar1[0] = '\x01';
              pcVar1[1] = '\0';
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                          *)&pmVar7->inst,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         &local_140);
              if (local_140._M_head_impl != (Inst *)0x0) {
                (*((local_140._M_head_impl)->super_Displayable)._vptr_Displayable[5])();
              }
            }
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)local_100);
          }
          uVar13 = uVar13 + 1;
          p_Var11 = p_Var9[3]._M_parent;
        } while (uVar13 < (ulong)((long)p_Var9[3]._M_left - (long)p_Var11 >> 3));
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_d0);
  }
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
               *)local_78);
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::~_Rb_tree(&local_a8);
  return;
}

Assistant:

void unroll_phi() {
    LOG(TRACE) << " is unrolling phi for " << func.name << std::endl;
    var_replace::Var_Replace vp(func);
    for (auto& blkpair : func.basic_blks) {
      for (auto i = 0; i < blkpair.second.inst.size(); ++i) {
        auto& inst = blkpair.second.inst.at(i);
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          phi_dests.insert(inst->dest);
          for (auto var : inst->useVars()) {
            func.basic_blks.at(vp.defpoint.at(var).first)
                .inst.push_back(std::make_unique<mir::inst::AssignInst>(
                    blkpair.second.inst.at(i)->dest, var));
          }
        }
      }
    }
    // LOG(TRACE) << func << std::endl;
  }